

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_inter_pred_luma_copy_w16out_ssse3
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  int iVar1;
  int iVar2;
  UWORD8 *pUVar3;
  int offset;
  long lVar4;
  WORD16 *pWVar5;
  int iVar6;
  undefined1 in_XMM0 [16];
  undefined1 auVar7 [16];
  
  if ((wd & 1U) != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x5e8,
                  "void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((ht & 1U) == 0) {
    iVar1 = src_strd * 2;
    iVar2 = dst_strd * 2;
    pWVar5 = pi2_dst + dst_strd;
    pUVar3 = pu1_src + src_strd;
    iVar6 = 0;
    if ((wd & 6U) == 0) {
      for (; iVar6 < ht; iVar6 = iVar6 + 2) {
        for (lVar4 = 0; (int)lVar4 < wd; lVar4 = lVar4 + 8) {
          auVar7 = pmovzxbw(in_XMM0,*(undefined8 *)(pu1_src + lVar4));
          auVar7 = psllw(auVar7,6);
          *(undefined1 (*) [16])(pi2_dst + lVar4) = auVar7;
          auVar7 = pmovzxbw(auVar7,*(undefined8 *)(pUVar3 + lVar4));
          in_XMM0 = psllw(auVar7,6);
          *(undefined1 (*) [16])(pWVar5 + lVar4) = in_XMM0;
        }
        pu1_src = pu1_src + iVar1;
        pWVar5 = pWVar5 + iVar2;
        pUVar3 = pUVar3 + iVar1;
        pi2_dst = pi2_dst + iVar2;
      }
    }
    else {
      for (; iVar6 < ht; iVar6 = iVar6 + 2) {
        for (lVar4 = 0; (int)lVar4 < wd; lVar4 = lVar4 + 4) {
          auVar7 = pmovzxbw(in_XMM0,*(undefined8 *)(pu1_src + lVar4));
          auVar7 = psllw(auVar7,6);
          *(long *)(pi2_dst + lVar4) = auVar7._0_8_;
          auVar7 = pmovzxbw(auVar7,*(undefined8 *)(pUVar3 + lVar4));
          in_XMM0 = psllw(auVar7,6);
          *(long *)(pWVar5 + lVar4) = in_XMM0._0_8_;
        }
        pu1_src = pu1_src + iVar1;
        pWVar5 = pWVar5 + iVar2;
        pUVar3 = pUVar3 + iVar1;
        pi2_dst = pi2_dst + iVar2;
      }
    }
    return;
  }
  __assert_fail("(ht % 2 == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                ,0x5e9,
                "void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *pu1_src,
                                             WORD16 *pi2_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    __m128i  s3, zero_8x16b;

    ASSERT(wd % 2 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/
    UNUSED(pi1_coeff);
    zero_8x16b = _mm_setzero_si128();
/*  outer for loop starts from here */
    if(wd % 8 == 0) /* wd = multiple of 8 case */
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < wd; col += 8)
            {
/* row =0 */
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_store_si128((__m128i *)(pi2_dst + offset), s3);

/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_store_si128((__m128i *)(pi2_dst + dst_strd + offset), s3);

                offset += 8; /* To pointer update */
            } /* inner for loop ends here(8-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer update */
            pi2_dst += 2 * dst_strd; /* pointer update */
        }
    }
    else /* wd = multiple of 4 case */
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < wd; col += 4)
            {
/* row =0 */
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_storel_epi64((__m128i *)(pi2_dst + offset), s3);

/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_storel_epi64((__m128i *)(pi2_dst + dst_strd + offset), s3);
                offset += 4; /* To pointer update */
            } /* inner for loop ends here(4-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer update */
            pi2_dst += 2 * dst_strd; /* pointer update */
        }
    }

}